

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O3

int scep_conf_init(char *filename,int operation_flag)

{
  int iVar1;
  uint uVar2;
  CONF_METHOD *meth;
  FILE *pFVar3;
  SCEP_CONF *pSVar4;
  scep_engine_conf_st *psVar5;
  char *pcVar6;
  FILE *section;
  stack_st_CONF_VALUE *psVar7;
  char *pcVar8;
  NAME_VALUE_PAIR **ppNVar9;
  long lVar10;
  NAME_VALUE_PAIR *pNVar11;
  uint *puVar12;
  FILE *__stream;
  char *__format;
  ulong uVar13;
  long err;
  long local_38;
  
  if (filename == (char *)0x0) {
    return 0;
  }
  meth = NCONF_default();
  pFVar3 = (FILE *)NCONF_new(meth);
  iVar1 = NCONF_load((CONF *)pFVar3,filename,&local_38);
  if (iVar1 == 0) {
    pFVar3 = (FILE *)&stderr;
    __stream = _stderr;
    if (local_38 == 0) {
      fprintf(_stderr,"%s: Error opening configuration file\n",pname);
      goto LAB_0010a1d7;
    }
  }
  else {
    pSVar4 = (SCEP_CONF *)malloc(0x10);
    scep_conf = pSVar4;
    psVar5 = (scep_engine_conf_st *)calloc(1,0x58);
    pSVar4->engine = psVar5;
    pSVar4->engine_str = (char *)0x0;
    pcVar6 = NCONF_get_string((CONF *)pFVar3,"sscep","CACertFile");
    if ((pcVar6 != (char *)0x0) && (c_flag == 0)) {
      c_flag = 1;
      c_char = strdup(pcVar6);
      if (c_char == (char *)0x0) goto LAB_0010a17e;
    }
    pcVar6 = NCONF_get_string((CONF *)pFVar3,"sscep","CAIdentifier");
    if ((pcVar6 != (char *)0x0) && (i_flag == 0)) {
      i_flag = 1;
      i_char = strdup(pcVar6);
      if (i_char == (char *)0x0) goto LAB_0010a17e;
    }
    pcVar6 = NCONF_get_string((CONF *)pFVar3,"sscep","Debug");
    if ((((pcVar6 != (char *)0x0) && (d_flag == 0)) && (*pcVar6 == 't')) &&
       ((pcVar6[1] == 'r' && (pcVar6[2] == 'u')))) {
      d_flag = 1;
    }
    pcVar6 = NCONF_get_string((CONF *)pFVar3,"sscep","EncAlgorithm");
    if ((pcVar6 != (char *)0x0) && (E_flag == 0)) {
      E_flag = 1;
      E_char = strdup(pcVar6);
      if (E_char == (char *)0x0) goto LAB_0010a17e;
    }
    pcVar6 = NCONF_get_string((CONF *)pFVar3,"sscep","SigAlgorithm");
    if ((pcVar6 != (char *)0x0) && (S_flag == 0)) {
      S_flag = 1;
      S_char = strdup(pcVar6);
      if (S_char == (char *)0x0) goto LAB_0010a17e;
    }
    pcVar6 = NCONF_get_string((CONF *)pFVar3,"sscep","Proxy");
    if ((pcVar6 != (char *)0x0) && (p_flag == 0)) {
      p_flag = 1;
      p_char = strdup(pcVar6);
      if (p_char == (char *)0x0) goto LAB_0010a17e;
    }
    pcVar6 = NCONF_get_string((CONF *)pFVar3,"sscep","URL");
    if ((pcVar6 != (char *)0x0) && (u_flag == 0)) {
      u_flag = 1;
      url_char = strdup(pcVar6);
      if (url_char == (char *)0x0) goto LAB_0010a17e;
    }
    pcVar6 = NCONF_get_string((CONF *)pFVar3,"sscep","MonitorInformation");
    if ((pcVar6 != (char *)0x0) && (M_flag == 0)) {
      M_flag = 1;
      M_char = strdup(pcVar6);
      if (M_char == (char *)0x0) {
LAB_0010a17e:
        error_memory();
      }
    }
    pcVar6 = NCONF_get_string((CONF *)pFVar3,"sscep","Verbose");
    if ((((pcVar6 != (char *)0x0) && (v_flag == 0)) && (*pcVar6 == 't')) &&
       ((pcVar6[1] == 'r' && (pcVar6[2] == 'u')))) {
      v_flag = 1;
    }
    switch(operation_flag - 1U >> 1 | (uint)((operation_flag - 1U & 1) != 0) << 0x1f) {
    case 0:
      scep_conf_load_operation_getca((CONF *)pFVar3);
      break;
    case 1:
      scep_conf_load_operation_enroll((CONF *)pFVar3);
      break;
    case 2:
      scep_conf_load_operation_getcert((CONF *)pFVar3);
      break;
    case 3:
      scep_conf_load_operation_getcrl((CONF *)pFVar3);
      break;
    default:
      scep_conf_init_cold_1();
      break;
    case 7:
      scep_conf_load_operation_getnextca((CONF *)pFVar3);
    }
    section = (FILE *)NCONF_get_string((CONF *)pFVar3,"sscep","engine");
    if (section == (FILE *)0x0) {
      if (d_flag != 0) {
        printf("%s: No engine section specified, not loading an engine\n",pname);
      }
      pSVar4 = scep_conf;
      scep_conf->engine_str = (char *)0x0;
      free(pSVar4->engine);
      scep_conf->engine = (scep_engine_conf_st *)0x0;
      return 0;
    }
    scep_conf->engine_str = (char *)section;
    psVar7 = NCONF_get_section((CONF *)pFVar3,(char *)section);
    if (psVar7 == (stack_st_CONF_VALUE *)0x0) {
      scep_conf_init_cold_4();
      __stream = section;
    }
    else {
      if (d_flag != 0) {
        printf("%s: Engine Section %s found and processing it\n",pname,"engine");
      }
      __stream = pFVar3;
      pcVar6 = NCONF_get_string((CONF *)pFVar3,(char *)section,"engine_id");
      if (pcVar6 != (char *)0x0) {
        if (v_flag != 0) {
          printf("%s: Configuration: Engine ID set to %s\n",pname,pcVar6);
        }
        scep_conf->engine->engine_id = pcVar6;
        pcVar6 = (char *)malloc(0x18);
        sprintf(pcVar6,"sscep_engine_%s",scep_conf->engine->engine_id);
        psVar5 = scep_conf->engine;
        iVar1 = strncmp(psVar5->engine_id,"capi",4);
        if (iVar1 == 0) {
          pcVar8 = NCONF_get_string((CONF *)pFVar3,pcVar6,"new_key_location");
          if (pcVar8 == (char *)0x0) {
            pcVar8 = "REQUEST";
            if (v_flag != 0) {
              printf("%s: No new key location was provided, using default \"REQUEST\"\n",pname);
            }
          }
          else if (v_flag != 0) {
            printf("%s: Location of the new key will be in %s\n",pname,pcVar8);
          }
          scep_conf->engine->new_key_location = pcVar8;
          pcVar8 = NCONF_get_string((CONF *)pFVar3,pcVar6,"storelocation");
          if (pcVar8 == (char *)0x0) {
            if (v_flag == 0) {
LAB_00109d10:
              iVar1 = 0;
            }
            else {
              iVar1 = 0;
              printf("%s: No storename was provided. Will use the engines default.\n",pname);
            }
          }
          else {
            if (v_flag != 0) {
              printf("%s: The store used will be %s\n",pname,pcVar8);
            }
            iVar1 = strncmp(pcVar8,"LOCAL_MACHINE",0xd);
            if (iVar1 == 0) {
              iVar1 = 1;
            }
            else {
              iVar1 = strncmp(pcVar8,"CURRENT_USER",0xc);
              if (iVar1 == 0) goto LAB_00109d10;
              iVar1 = 0;
              printf("%s: Provided storename unknown (%s). Will use the engines default.\n",pname,
                     pcVar8);
            }
          }
          psVar5 = scep_conf->engine;
          psVar5->storelocation = iVar1;
        }
        iVar1 = strncmp(psVar5->engine_id,"jksengine",9);
        if (iVar1 == 0) {
          pcVar8 = NCONF_get_string((CONF *)pFVar3,pcVar6,"KeyStorePass");
          if (pcVar8 != (char *)0x0) {
            if (v_flag != 0) {
              printf("%s: KeyStorePass will be set to %s\n",pname,pcVar8);
            }
            scep_conf->engine->storepass = pcVar8;
          }
          pcVar8 = NCONF_get_string((CONF *)pFVar3,pcVar6,"JavaConnectorPath");
          if (pcVar8 != (char *)0x0) {
            if (v_flag != 0) {
              printf("%s: JavaConnectorPath will be set to %s\n",pname,pcVar8);
            }
            scep_conf->engine->jconnpath = pcVar8;
          }
          pcVar8 = NCONF_get_string((CONF *)pFVar3,pcVar6,"KeyStoreProvider");
          if (pcVar8 != (char *)0x0) {
            if (v_flag != 0) {
              printf("%s: KeyStoreProvider will be set to %s\n",pname,pcVar8);
            }
            scep_conf->engine->provider = pcVar8;
          }
          pcVar8 = NCONF_get_string((CONF *)pFVar3,pcVar6,"JavaPath");
          if (pcVar8 == (char *)0x0) {
            psVar5 = scep_conf->engine;
          }
          else {
            if (v_flag != 0) {
              printf("%s: JavaPath will be set to %s\n",pname,pcVar8);
            }
            psVar5 = scep_conf->engine;
            psVar5->javapath = pcVar8;
          }
        }
        iVar1 = strncmp(psVar5->engine_id,"pkcs11",6);
        if (iVar1 == 0) {
          psVar5->pin = (char *)0x0;
          pcVar6 = NCONF_get_string((CONF *)pFVar3,pcVar6,"PIN");
          if (pcVar6 != (char *)0x0) {
            if (v_flag != 0) {
              printf("%s: Setting PIN to configuration value\n",pname);
            }
            scep_conf->engine->pin = pcVar6;
          }
        }
        pcVar6 = NCONF_get_string((CONF *)pFVar3,(char *)section,"dynamic_path");
        if (pcVar6 == (char *)0x0) {
          if (v_flag == 0) {
            pcVar8 = (char *)0x0;
            goto LAB_00109f49;
          }
          pcVar6 = scep_conf->engine->engine_id;
          __format = "%s: Not setting a dynamic path. Not dynamic loading supported for engine %s\n"
          ;
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8 = pcVar6;
          if (v_flag == 0) goto LAB_00109f49;
          __format = "%s: Setting dynamic dll path to %s\n";
        }
        printf(__format,pname,pcVar6);
LAB_00109f49:
        scep_conf->engine->dynamic_path = pcVar8;
        pcVar6 = NCONF_get_string((CONF *)pFVar3,(char *)section,"MODULE_PATH");
        if (pcVar6 == (char *)0x0) {
          scep_conf->engine->module_path = (char *)0x0;
          if (v_flag != 0) {
            printf("%s: No module path defined, not using/loading any module\n",pname);
          }
        }
        else {
          if (v_flag != 0) {
            printf("%s: Setting module path to %s\n",pname,pcVar6);
          }
          scep_conf->engine->module_path = pcVar6;
        }
        pcVar6 = NCONF_get_string((CONF *)pFVar3,(char *)section,"cmds");
        if (pcVar6 == (char *)0x0) {
          scep_conf->engine->cmds = (NAME_VALUE_PAIR **)0x0;
          if (v_flag != 0) {
            printf("%s: No engine cmds section defined\n",pname);
          }
        }
        else {
          psVar7 = NCONF_get_section((CONF *)pFVar3,pcVar6);
          if (psVar7 == (stack_st_CONF_VALUE *)0x0) {
            scep_conf_init_cold_2();
            pFVar3 = _stderr;
            pcVar6 = pname;
            puVar12 = (uint *)__errno_location();
            fprintf(pFVar3,"%s: memory allocation failure, errno: %d\n",pcVar6,(ulong)*puVar12);
            exit(1);
          }
          if (d_flag != 0) {
            printf("%s: Engine Cmds Section %s found and processing it\n",pname,pcVar6);
          }
          psVar7 = NCONF_get_section((CONF *)pFVar3,pcVar6);
          uVar2 = OPENSSL_sk_num(psVar7);
          if (d_flag != 0) {
            printf("%s: There are %d engine commands\n",pname,(ulong)uVar2);
          }
          ppNVar9 = (NAME_VALUE_PAIR **)
                    CRYPTO_malloc(uVar2 * 8 + 8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/certnanny[P]sscep/src/configuration.c"
                                  ,0x126);
          scep_conf->engine->cmds = ppNVar9;
          if (0 < (int)uVar2) {
            uVar13 = 0;
            do {
              lVar10 = OPENSSL_sk_value(psVar7,uVar13 & 0xffffffff);
              if (d_flag != 0) {
                printf("%s: Engine cmd: %s = %s\n",pname,*(undefined8 *)(lVar10 + 8),
                       *(undefined8 *)(lVar10 + 0x10));
              }
              pNVar11 = NAME_VALUE_PAIR_new(*(char **)(lVar10 + 8),*(char **)(lVar10 + 0x10));
              scep_conf->engine->cmds[uVar13] = pNVar11;
              uVar13 = uVar13 + 1;
            } while (uVar2 != uVar13);
            ppNVar9 = scep_conf->engine->cmds;
          }
          ppNVar9[(int)uVar2] = (NAME_VALUE_PAIR *)0x0;
        }
        return 0;
      }
    }
    scep_conf_init_cold_3();
  }
  fprintf(__stream,"%s: Error in %s on line %li\n");
  ERR_print_errors_fp(*(FILE **)pFVar3);
LAB_0010a1d7:
  exit(0x5d);
}

Assistant:

int scep_conf_init(char *filename, int operation_flag) {
	long err;
	CONF *conf;
	char *engine_section, *var, *engine_special_section;

	if(filename == NULL) {
		return 0;
	}
	conf = NCONF_new(NCONF_default());
	if(!NCONF_load(conf, filename, &err)) {
		if(err == 0)
			fprintf(stderr, "%s: Error opening configuration file\n", pname);
		else {
			fprintf(stderr, "%s: Error in %s on line %li\n", pname, filename, err);
			ERR_print_errors_fp(stderr);
		}
		exit(SCEP_PKISTATUS_FILE);
	}
		
	scep_conf = malloc(sizeof(*scep_conf));
	scep_conf->engine = malloc(sizeof(struct scep_engine_conf_st));
	scep_conf->engine_str = NULL;
	memset(scep_conf->engine, 0, sizeof(struct scep_engine_conf_st));

	//load global scep vars
	if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION, SCEP_CONFIGURATION_PARAM_CACERTFILE)) && !c_flag) {
		c_flag = 1;
		if(!(c_char = strdup(var)))
			error_memory();
	}

	if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION, SCEP_CONFIGURATION_PARAM_CAIDENTIFIER)) && !i_flag) {
		i_flag = 1;
		if(!(i_char = strdup(var)))
			error_memory();
	}

	if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION, SCEP_CONFIGURATION_PARAM_DEBUG)) && !d_flag) {
		if(!strncmp(var, "true", 3) && !d_flag)	
			d_flag = 1;
	}

	if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION, SCEP_CONFIGURATION_PARAM_ENCALGORITHM)) && !E_flag) {
		E_flag = 1;
		if(!(E_char = strdup(var)))
			error_memory();
	}

	if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION, SCEP_CONFIGURATION_PARAM_SIGALGORITHM)) && !S_flag) {
		S_flag = 1;
		if(!(S_char = strdup(var)))
			error_memory();
	}

	if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION, SCEP_CONFIGURATION_PARAM_PROXY)) && !p_flag) {
		p_flag = 1;
		if(!(p_char = strdup(var)))
			error_memory();
	}

	if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION, SCEP_CONFIGURATION_PARAM_URL)) && !u_flag) {
		u_flag = 1;
		if(!(url_char = strdup(var)))
			error_memory();
	}

	if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION, SCEP_CONFIGURATION_PARAM_MONITORINFO)) && !M_flag) {
		M_flag = 1;
		if(!(M_char = strdup(var)))
			error_memory();
	}

	if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION, SCEP_CONFIGURATION_PARAM_VERBOSE)) && !v_flag) {
		if(!strncmp(var, "true", 3) && !v_flag)
			v_flag = 1;
	}

	//loading options for specific operation
	switch(operation_flag) {
		case SCEP_OPERATION_ENROLL:
			scep_conf_load_operation_enroll(conf);
			break;
		case SCEP_OPERATION_GETCA:
			scep_conf_load_operation_getca(conf);
			break;
		case SCEP_OPERATION_GETCERT:
			scep_conf_load_operation_getcert(conf);
			break;
		case SCEP_OPERATION_GETCRL:
			scep_conf_load_operation_getcrl(conf);
			break;
		case SCEP_OPERATION_GETNEXTCA:
			scep_conf_load_operation_getnextca(conf);
			break;
		default:
			fprintf(stderr, "No operation specified, can't load specific settings!\n");
			break;
	}




	//load engine vars
	if(!(engine_section = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION, SCEP_CONFIGURATION_PARAM_ENGINE))) {
		if(d_flag) {
			printf("%s: No engine section specified, not loading an engine\n", pname);
		}
		scep_conf->engine_str = NULL;
		free(scep_conf->engine);
		scep_conf->engine = NULL;
	} else {
		//set the engine_str variable to save the section name
		scep_conf->engine_str = engine_section;
		if(!NCONF_get_section(conf, engine_section)) {
			fprintf(stderr, "%s: Section %s defined but not found!\n", pname, engine_section);
			exit(SCEP_PKISTATUS_FILE);
		}

		//engine is specified, lets load parameters
		if(d_flag) 
			printf("%s: Engine Section %s found and processing it\n", pname, SCEP_CONFIGURATION_PARAM_ENGINE);

		//getting engine ID
		if((var = NCONF_get_string(conf, engine_section, SCEP_CONFIGURATION_ENGINE_ID))) {
			if(v_flag)
				printf("%s: Configuration: Engine ID set to %s\n", pname, var);
			scep_conf->engine->engine_id = var;
		} else {
			fprintf(stderr, "%s: Engine ID not specified, cannot continue. Please provide an eninge ID\n", pname);
			exit(SCEP_PKISTATUS_FILE);
		}

		
        //write g_char, but ONLY if not defined already (command line overwrites config file)
#ifdef WITH_ENGINES
		if(!g_flag) {
			g_flag = 1;
			g_char = strdup(scep_conf->engine->engine_id);
		}
#endif
		//load the special section string
		engine_special_section = (char *) malloc(sizeof(SCEP_CONFIGURATION_SECTION_ENGINE_TEMPLATE) + sizeof(scep_conf->engine->engine_id));
		sprintf(engine_special_section, SCEP_CONFIGURATION_SECTION_ENGINE_TEMPLATE, scep_conf->engine->engine_id);

		//load capi only option
		//TODO move
		if(strncmp(scep_conf->engine->engine_id, "capi", 4) == 0) {
			if((var = NCONF_get_string(conf, engine_special_section, SCEP_CONFIGURATION_ENGINE_CAPI_NEWKEYLOCATION))) {
				if(v_flag)
					printf("%s: Location of the new key will be in %s\n", pname, var);
				scep_conf->engine->new_key_location = var;
			} else {
				if(v_flag)
					printf("%s: No new key location was provided, using default \"REQUEST\"\n", pname);
				scep_conf->engine->new_key_location = "REQUEST";
			}

			if((var = NCONF_get_string(conf, engine_special_section, SCEP_CONFIGURATION_ENGINE_CAPI_STORELOCATION))) {
				if(v_flag)
					printf("%s: The store used will be %s\n", pname, var);
				if(!strncmp(var, "LOCAL_MACHINE", 13)) {
					scep_conf->engine->storelocation = 1;
				} else if(!strncmp(var, "CURRENT_USER", 12)) {
					scep_conf->engine->storelocation = 0;
				} else {
					printf("%s: Provided storename unknown (%s). Will use the engines default.\n", pname, var);
					scep_conf->engine->storelocation = 0;
				}
			} else {
				if(v_flag)
					printf("%s: No storename was provided. Will use the engines default.\n", pname);
				scep_conf->engine->storelocation = 0;
			}

			
		}

		//load JKSEngine only option
		//TODO move
		if(strncmp(scep_conf->engine->engine_id, "jksengine", 9) == 0) {
			if((var = NCONF_get_string(conf, engine_special_section, SCEP_CONFIGURATION_ENGINE_JKSENGINE_KEYSTOREPASS))) {
				if(v_flag)
					printf("%s: KeyStorePass will be set to %s\n", pname, var);
				scep_conf->engine->storepass = var;
			}

			if((var = NCONF_get_string(conf, engine_special_section, SCEP_CONFIGURATION_ENGINE_JKSENGINE_JCONNPATH))) {
				if(v_flag)
					printf("%s: JavaConnectorPath will be set to %s\n", pname, var);
				scep_conf->engine->jconnpath = var;
			}

			if((var = NCONF_get_string(conf, engine_special_section, SCEP_CONFIGURATION_ENGINE_JKSENGINE_PROVIDER))) {
				if(v_flag)
					printf("%s: KeyStoreProvider will be set to %s\n", pname, var);
				scep_conf->engine->provider = var;
			}

			if((var = NCONF_get_string(conf, engine_special_section, SCEP_CONFIGURATION_ENGINE_JKSENGINE_JAVAPATH))) {
				if(v_flag)
					printf("%s: JavaPath will be set to %s\n", pname, var);
				scep_conf->engine->javapath = var;
			}
		}

		//load PKCS11 only options
		//TODO move
		if(strncmp(scep_conf->engine->engine_id, "pkcs11", 6) == 0) {
			scep_conf->engine->pin = NULL;
			if((var = NCONF_get_string(conf, engine_special_section, SCEP_CONFIGURATION_ENGINE_PKCS11_PIN))) {
				if(v_flag)
					printf("%s: Setting PIN to configuration value\n", pname);
				scep_conf->engine->pin = var;
			}
		}

		//loading dynamic path variable
		if((var = NCONF_get_string(conf, engine_section, SCEP_CONFIGURATION_ENGINE_DYNPATH))) {
			if(v_flag)
				printf("%s: Setting dynamic dll path to %s\n", pname, var);
			scep_conf->engine->dynamic_path = var;
		} else {
			if(v_flag)
				printf("%s: Not setting a dynamic path. Not dynamic loading supported for engine %s\n", pname, scep_conf->engine->engine_id);
#ifdef WIN32
			// this function creates the dynamic path to the engine based on
			// the "%WINDIR%" environment variable, the system directory, and
			// the engine identifier; in case it succeeds, the function writes
			// the result into the last argument
			if(!createEnginePath(getenv("WINDIR"), "System32", scep_conf->engine->engine_id, &scep_conf->engine->dynamic_path)) {
				return 0;
			}
#else
			scep_conf->engine->dynamic_path = NULL;
#endif
		}

		//loading module path variable
		if((var = NCONF_get_string(conf, engine_section, SCEP_CONFIGURATION_ENGINE_MODULEPATH))) {
			if(v_flag)
				printf("%s: Setting module path to %s\n", pname, var);
			scep_conf->engine->module_path = var;
		} else {
			scep_conf->engine->module_path = NULL;
			if(v_flag)
				printf("%s: No module path defined, not using/loading any module\n", pname);
		}

		// If there is a section specified in 'engine_section/cmds', store all those commands IN ORDER
		char *cmds_section;
		if((cmds_section = NCONF_get_string(conf, engine_section, SCEP_CONFIGURATION_ENGINE_CMDS))) {
			if(!NCONF_get_section(conf, cmds_section)) {
				fprintf(stderr, "%s: Section %s defined but not found!\n", pname, cmds_section);
				exit(SCEP_PKISTATUS_FILE);
			}

			// A cmds section was specified. Read all values in there and store for later passing to the engine
			if(d_flag)
				printf("%s: Engine Cmds Section %s found and processing it\n", pname, cmds_section);

			STACK_OF(CONF_VALUE) *section;
			section = NCONF_get_section(conf, cmds_section);
			int number_of_cmds = sk_CONF_VALUE_num(section);
			if(d_flag)
				printf("%s: There are %d engine commands\n", pname, number_of_cmds);
			scep_conf->engine->cmds = OPENSSL_malloc((number_of_cmds+1) * sizeof(NAME_VALUE_PAIR*));

			int i;
			for(i=0; i<number_of_cmds; i++) {
				CONF_VALUE* conf_value;
				conf_value = sk_CONF_VALUE_value(section, i);
				if(d_flag)
					printf("%s: Engine cmd: %s = %s\n", pname, conf_value->name, conf_value->value);
				scep_conf->engine->cmds[i] = NAME_VALUE_PAIR_new(conf_value->name, conf_value->value);
			}

			// NULL terminate the array to indicate where it ends
			scep_conf->engine->cmds[number_of_cmds] = NULL;
		} else {
			scep_conf->engine->cmds = NULL;
			if(v_flag)
				printf("%s: No engine cmds section defined\n", pname);
		}

	}


	return 0;
}